

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_reservoir_sample.cpp
# Opt level: O3

void __thiscall
duckdb::BaseReservoirSampling::InitializeReservoirWeights
          (BaseReservoirSampling *this,idx_t cur_size,idx_t sample_size)

{
  unsigned_long local_38;
  double local_30;
  
  if (cur_size == sample_size) {
    local_38 = 0;
    if (cur_size != 0) {
      do {
        local_30 = RandomEngine::NextRandom((RandomEngine *)this);
        local_30 = -local_30;
        ::std::
        priority_queue<std::pair<double,unsigned_long>,std::vector<std::pair<double,unsigned_long>,std::allocator<std::pair<double,unsigned_long>>>,std::less<std::pair<double,unsigned_long>>>
        ::emplace<double,unsigned_long&>
                  ((priority_queue<std::pair<double,unsigned_long>,std::vector<std::pair<double,unsigned_long>,std::allocator<std::pair<double,unsigned_long>>>,std::less<std::pair<double,unsigned_long>>>
                    *)&this->reservoir_weights,&local_30,&local_38);
        local_38 = local_38 + 1;
      } while (local_38 < cur_size);
    }
    SetNextEntry(this);
  }
  return;
}

Assistant:

void BaseReservoirSampling::InitializeReservoirWeights(idx_t cur_size, idx_t sample_size) {
	//! 1: The first m items of V are inserted into R
	//! first we need to check if the reservoir already has "m" elements
	//! 2. For each item vi ∈ R: Calculate a key ki = random(0, 1)
	//! we then define the threshold to enter the reservoir T_w as the minimum key of R
	//! we use a priority queue to extract the minimum key in O(1) time
	if (cur_size == sample_size) {
		//! 2. For each item vi ∈ R: Calculate a key ki = random(0, 1)
		//! we then define the threshold to enter the reservoir T_w as the minimum key of R
		//! we use a priority queue to extract the minimum key in O(1) time
		for (idx_t i = 0; i < sample_size; i++) {
			double k_i = random.NextRandom();
			reservoir_weights.emplace(-k_i, i);
		}
		SetNextEntry();
	}
}